

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O3

void __thiscall glslang::TGlslIoMapper::TGlslIoMapper(TGlslIoMapper *this)

{
  TPoolAllocator *pTVar1;
  
  (this->super_TIoMapper)._vptr_TIoMapper = (_func_int **)&PTR__TGlslIoMapper_009282a0;
  this->hadError = false;
  pTVar1 = GetThreadPoolAllocator();
  (this->autoPushConstantBlockName)._M_dataplus.super_allocator_type.allocator = pTVar1;
  (this->autoPushConstantBlockName)._M_dataplus._M_p =
       (pointer)&(this->autoPushConstantBlockName).field_2;
  (this->autoPushConstantBlockName)._M_string_length = 0;
  (this->autoPushConstantBlockName).field_2._M_local_buf[0] = '\0';
  this->intermediates[0] = (TIntermediate *)0x0;
  this->intermediates[1] = (TIntermediate *)0x0;
  this->intermediates[2] = (TIntermediate *)0x0;
  this->intermediates[3] = (TIntermediate *)0x0;
  this->intermediates[4] = (TIntermediate *)0x0;
  this->intermediates[5] = (TIntermediate *)0x0;
  this->intermediates[6] = (TIntermediate *)0x0;
  this->intermediates[7] = (TIntermediate *)0x0;
  this->intermediates[8] = (TIntermediate *)0x0;
  this->intermediates[9] = (TIntermediate *)0x0;
  this->intermediates[10] = (TIntermediate *)0x0;
  this->intermediates[0xb] = (TIntermediate *)0x0;
  this->intermediates[0xc] = (TIntermediate *)0x0;
  this->intermediates[0xd] = (TIntermediate *)0x0;
  memset(this->inVarMaps,0,0x150);
  this->profile = ENoProfile;
  this->version = 0;
  this->autoPushConstantMaxSize = 0x80;
  this->autoPushConstantBlockPacking = ElpStd430;
  return;
}

Assistant:

TGlslIoMapper::TGlslIoMapper() {
    memset(inVarMaps,     0, sizeof(TVarLiveMap*)   * EShLangCount);
    memset(outVarMaps,    0, sizeof(TVarLiveMap*)   * EShLangCount);
    memset(uniformVarMap, 0, sizeof(TVarLiveMap*)   * EShLangCount);
    memset(intermediates, 0, sizeof(TIntermediate*) * EShLangCount);
    profile = ENoProfile;
    version = 0;
    autoPushConstantMaxSize = 128;
    autoPushConstantBlockPacking = ElpStd430;
}